

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void CheckLowerCaseAttrValue(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Lexer *pLVar1;
  Bool BVar2;
  tmbstr ptVar3;
  char *pcVar4;
  
  pcVar4 = attval->value;
  if (pcVar4 != (char *)0x0) {
    do {
      if (*pcVar4 == '\0') {
        return;
      }
      BVar2 = prvTidyIsUpper((int)*pcVar4);
      pcVar4 = pcVar4 + 1;
    } while (BVar2 == no);
    pLVar1 = doc->lexer;
    if (((pLVar1->isvoyager != no) &&
        (prvTidyReportAttrError(doc,node,attval,0x226), pLVar1->isvoyager != no)) ||
       (*(int *)((doc->config).value + 0x2e) != 0)) {
      ptVar3 = prvTidytmbstrtolower(attval->value);
      attval->value = ptVar3;
    }
  }
  return;
}

Assistant:

static void CheckLowerCaseAttrValue( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    Bool hasUpper = no;
    
    if (!AttrHasValue(attval))
        return;

    p = attval->value;
    
    while (*p)
    {
        if (TY_(IsUpper)(*p)) /* #501230 - fix by Terry Teague - 09 Jan 02 */
        {
            hasUpper = yes;
            break;
        }
        p++;
    }

    if (hasUpper)
    {
        Lexer* lexer = doc->lexer;
        if (lexer->isvoyager)
            TY_(ReportAttrError)( doc, node, attval, ATTR_VALUE_NOT_LCASE);
  
        if ( lexer->isvoyager || cfgBool(doc, TidyLowerLiterals) )
            attval->value = TY_(tmbstrtolower)(attval->value);
    }
}